

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

void PrintExtraInfoLossless(WebPPicture *pic,int short_output,char *file_name)

{
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  WebPAuxStats *stats;
  char *in_stack_ffffffffffffffd8;
  WebPAuxStats *stats_00;
  
  stats_00 = *(WebPAuxStats **)(in_RDI + 0x80);
  if (in_ESI == 0) {
    fprintf(stderr,"File:      %s\n",in_RDX);
    fprintf(stderr,"Dimension: %d x %d\n",(ulong)*(uint *)(in_RDI + 8),
            (ulong)*(uint *)(in_RDI + 0xc));
    fprintf(stderr,"Output:    %d bytes (%.2f bpp)\n",
            (double)((((float)stats_00->coded_size * 8.0) / (float)*(int *)(in_RDI + 8)) /
                    (float)*(int *)(in_RDI + 0xc)),(ulong)(uint)stats_00->coded_size);
    PrintFullLosslessInfo(stats_00,in_stack_ffffffffffffffd8);
  }
  else {
    fprintf(stderr,"%7d %2.2f\n",(double)stats_00->PSNR[3],(ulong)(uint)stats_00->coded_size);
  }
  return;
}

Assistant:

static void PrintExtraInfoLossless(const WebPPicture* const pic,
                                   int short_output,
                                   const char* const file_name) {
  const WebPAuxStats* const stats = pic->stats;
  if (short_output) {
    fprintf(stderr, "%7d %2.2f\n", stats->coded_size, stats->PSNR[3]);
  } else {
    WFPRINTF(stderr, "File:      %s\n", (const W_CHAR*)file_name);
    fprintf(stderr, "Dimension: %d x %d\n", pic->width, pic->height);
    fprintf(stderr, "Output:    %d bytes (%.2f bpp)\n", stats->coded_size,
            8.f * stats->coded_size / pic->width / pic->height);
    PrintFullLosslessInfo(stats, "ARGB");
  }
}